

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProduct,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcProduct *in;
  
  in = (IfcProduct *)operator_new(0x118);
  *(undefined ***)&in->field_0x100 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x108 = 0;
  *(char **)&in->field_0x110 = "IfcProduct";
  Assimp::IFC::Schema_2x3::IfcObject::IfcObject
            ((IfcObject *)in,&PTR_construction_vtable_24__0081f5f0);
  *(undefined8 *)&(in->super_IfcObject).field_0xd8 = 0;
  *(undefined8 *)&(in->super_IfcObject).field_0xe0 = 0;
  *(undefined ***)&in->super_IfcObject = &PTR__IfcProduct_0081f538;
  *(undefined ***)&in->field_0x100 = &PTR__IfcProduct_0081f5d8;
  *(undefined ***)&(in->super_IfcObject).field_0x88 = &PTR__IfcProduct_0081f560;
  (in->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcProduct_0081f588;
  *(undefined ***)&(in->super_IfcObject).field_0xd0 = &PTR__IfcProduct_0081f5b0;
  in->field_0xe8 = 0;
  (in->Representation).ptr.obj = (LazyObject *)0x0;
  (in->Representation).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcProduct>(db,params,in);
  return (Object *)
         (&(in->super_IfcObject).field_0x0 + *(long *)(*(long *)&in->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }